

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

iterator __thiscall
trompeloeil::list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>::push_front
          (list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer> *this,
          call_matcher_base<void_()> *t)

{
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar1;
  
  list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
            (&this->super_list_elem<trompeloeil::call_matcher_base<void_()>_>);
  plVar1 = (this->super_list_elem<trompeloeil::call_matcher_base<void_()>_>).next;
  (t->super_list_elem<trompeloeil::call_matcher_base<void_()>_>).next = plVar1;
  (t->super_list_elem<trompeloeil::call_matcher_base<void_()>_>).prev =
       &this->super_list_elem<trompeloeil::call_matcher_base<void_()>_>;
  plVar1->prev = &t->super_list_elem<trompeloeil::call_matcher_base<void_()>_>;
  (this->super_list_elem<trompeloeil::call_matcher_base<void_()>_>).next =
       &t->super_list_elem<trompeloeil::call_matcher_base<void_()>_>;
  list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check
            (&this->super_list_elem<trompeloeil::call_matcher_base<void_()>_>);
  return (iterator)&t->super_list_elem<trompeloeil::call_matcher_base<void_()>_>;
}

Assistant:

auto
  list<T, Disposer>::push_front(
    T* t)
  noexcept
  -> iterator
  {
    invariant_check();
    t->next = next;
    t->prev = this;
    next->prev = t;
    next = t;
    invariant_check();
    return {t};
  }